

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_wstring(void)

{
  undefined1 local_ac;
  undefined1 local_ab [2];
  allocator<wchar_t> local_a9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  undefined1 local_88 [8];
  variable data_1;
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"bravo");
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x94,"void ctor_suite::construct_wstring()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_a8,L"bravo",&local_a9);
  trial::dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::wstring>
            ((basic_variable<std::allocator<char>> *)local_88,&local_a8);
  std::__cxx11::wstring::~wstring((wstring *)&local_a8);
  std::allocator<wchar_t>::~allocator(&local_a9);
  local_ab[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                          ((basic_variable<std::allocator<char>_> *)local_88);
  local_ac = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<wstring>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x98,"void ctor_suite::construct_wstring()",local_ab,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  return;
}

Assistant:

void construct_wstring()
{
    {
        variable data(L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
    }
    {
        variable data(std::wstring(L"bravo"));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<wstring>(), true);
    }
}